

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.hpp
# Opt level: O0

void __thiscall
ableton::link::
Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
::forgetSession(Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
                *this,SessionId *sid)

{
  element_type *peVar1;
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  *__cont;
  __normal_iterator<std::pair<ableton::link::PeerState,_asio::ip::address>_*,_std::vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>_>
  local_58;
  const_iterator local_50;
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  *local_48;
  pair<ableton::link::PeerState,_asio::ip::address> *local_40;
  __normal_iterator<std::pair<ableton::link::PeerState,_asio::ip::address>_*,_std::vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>_>
  local_38;
  __normal_iterator<std::pair<ableton::link::PeerState,_asio::ip::address>_*,_std::vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>_>
  local_30;
  const_iterator local_28;
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  *local_20;
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  *peerVec;
  SessionId *sid_local;
  Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
  *this_local;
  
  peerVec = (vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
             *)sid;
  sid_local = (SessionId *)this;
  peVar1 = std::
           __shared_ptr_access<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  __cont = &peVar1->mPeers;
  local_20 = __cont;
  local_38._M_current =
       (pair<ableton::link::PeerState,_asio::ip::address> *)
       std::
       begin<std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
                 (__cont);
  local_40 = (pair<ableton::link::PeerState,_asio::ip::address> *)
             std::
             end<std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
                       (local_20);
  local_48 = peerVec;
  local_30 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>,ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>::SessionMemberPred>
                       (local_38,(__normal_iterator<std::pair<ableton::link::PeerState,_asio::ip::address>_*,_std::vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>_>
                                  )local_40,(SessionMemberPred)peerVec);
  __gnu_cxx::
  __normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>const*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
  ::__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>*>
            ((__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>const*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
              *)&local_28,&local_30);
  local_58._M_current =
       (pair<ableton::link::PeerState,_asio::ip::address> *)
       std::
       end<std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
                 (local_20);
  __gnu_cxx::
  __normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>const*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
  ::__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>*>
            ((__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>const*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>
              *)&local_50,&local_58);
  std::
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  ::erase(__cont,local_28,local_50);
  return;
}

Assistant:

void forgetSession(const SessionId& sid)
  {
    using namespace std;
    auto& peerVec = mpImpl->mPeers;
    peerVec.erase(
      remove_if(begin(peerVec), end(peerVec), SessionMemberPred{sid}), end(peerVec));
  }